

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::Separator(void)

{
  bool bVar1;
  uint col;
  ImGuiWindow *a;
  float _x;
  float _x_00;
  ImDrawList *unaff_retaddr;
  ImRect bb;
  float x2;
  float x1;
  ImGuiSeparatorFlags flags;
  ImGuiContext *g;
  ImGuiWindow *window;
  float in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  ImRect *in_stack_ffffffffffffffc8;
  float local_28;
  float local_24;
  float in_stack_ffffffffffffffe0;
  ImGuiContext *b;
  
  a = GetCurrentWindow();
  if ((a->SkipItems & 1U) == 0) {
    col = 1;
    if ((a->DC).LayoutType == 0) {
      col = 2;
    }
    if ((col & 2) == 0) {
      b = GImGui;
      if ((a->DC).ColumnsSet != (ImGuiColumnsSet *)0x0) {
        PopClipRect();
      }
      _x_00 = (a->Pos).x;
      _x = (a->Pos).x + (a->Size).x;
      bVar1 = ImVector<ImGuiGroupData>::empty(&(a->DC).GroupStack);
      if (!bVar1) {
        _x_00 = (a->DC).Indent.x + _x_00;
      }
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffcc,_x_00,(a->DC).CursorPos.y);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc4,_x,(a->DC).CursorPos.y + 1.0);
      ImRect::ImRect((ImRect *)&stack0xffffffffffffffd4,(ImVec2 *)&stack0xffffffffffffffcc,
                     (ImVec2 *)&stack0xffffffffffffffc4);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffbc,0.0,0.0);
      ItemSize((ImVec2 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc);
      bVar1 = ItemAdd(in_stack_ffffffffffffffc8,(ImGuiID)in_stack_ffffffffffffffc4,
                      (ImRect *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      if (bVar1) {
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffb4,local_24,local_28);
        GetColorU32((ImGuiCol)in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
        ImDrawList::AddLine(unaff_retaddr,(ImVec2 *)a,(ImVec2 *)b,col,_x_00);
        if ((b->LogEnabled & 1U) != 0) {
          LogRenderedText((ImVec2 *)b,(char *)CONCAT44(col,_x_00),
                          (char *)CONCAT44(_x,in_stack_ffffffffffffffe0));
        }
        if ((a->DC).ColumnsSet != (ImGuiColumnsSet *)0x0) {
          PushColumnClipRect((int)in_stack_ffffffffffffffb4);
          ((a->DC).ColumnsSet)->LineMinY = (a->DC).CursorPos.y;
        }
      }
      else if ((a->DC).ColumnsSet != (ImGuiColumnsSet *)0x0) {
        PushColumnClipRect((int)in_stack_ffffffffffffffb4);
      }
    }
    else {
      VerticalSeparator();
    }
  }
  return;
}

Assistant:

void ImGui::Separator()
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;
    ImGuiContext& g = *GImGui;

    // Those flags should eventually be overridable by the user
    ImGuiSeparatorFlags flags = (window->DC.LayoutType == ImGuiLayoutType_Horizontal) ? ImGuiSeparatorFlags_Vertical : ImGuiSeparatorFlags_Horizontal;
    IM_ASSERT(ImIsPowerOfTwo((int)(flags & (ImGuiSeparatorFlags_Horizontal | ImGuiSeparatorFlags_Vertical))));   // Check that only 1 option is selected
    if (flags & ImGuiSeparatorFlags_Vertical)
    {
        VerticalSeparator();
        return;
    }

    // Horizontal Separator
    if (window->DC.ColumnsSet)
        PopClipRect();

    float x1 = window->Pos.x;
    float x2 = window->Pos.x + window->Size.x;
    if (!window->DC.GroupStack.empty())
        x1 += window->DC.Indent.x;

    const ImRect bb(ImVec2(x1, window->DC.CursorPos.y), ImVec2(x2, window->DC.CursorPos.y+1.0f));
    ItemSize(ImVec2(0.0f, 0.0f)); // NB: we don't provide our width so that it doesn't get feed back into AutoFit, we don't provide height to not alter layout.
    if (!ItemAdd(bb, 0))
    {
        if (window->DC.ColumnsSet)
            PushColumnClipRect();
        return;
    }

    window->DrawList->AddLine(bb.Min, ImVec2(bb.Max.x,bb.Min.y), GetColorU32(ImGuiCol_Separator));

    if (g.LogEnabled)
        LogRenderedText(&bb.Min, "--------------------------------");

    if (window->DC.ColumnsSet)
    {
        PushColumnClipRect();
        window->DC.ColumnsSet->LineMinY = window->DC.CursorPos.y;
    }
}